

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::NanoVDBMediumProvider::Density
          (NanoVDBMediumProvider *this,Point3f *p,SampledWavelengths *lambda)

{
  ValueT VVar1;
  Vec3<float> xyz;
  Vec3<float> local_20;
  
  local_20.mVec[2] = (p->super_Tuple3<pbrt::Point3,_float>).z;
  local_20.mVec[0] = (p->super_Tuple3<pbrt::Point3,_float>).x;
  local_20.mVec[1] = (p->super_Tuple3<pbrt::Point3,_float>).y;
  xyz = nanovdb::Map::applyInverseMapF<nanovdb::Vec3<float>>
                  (&(this->densityFloatGrid->super_GridData).mMap,&local_20);
  local_20.mVec._0_8_ = this->densityFloatGrid + 1;
  VVar1 = nanovdb::
          SampleFromVoxels<nanovdb::Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>,_1,_false>
          ::operator()<float,_nanovdb::Vec3>
                    ((SampleFromVoxels<nanovdb::Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>,_1,_false>
                      *)&local_20,xyz);
  return (array<float,_4>)CONCAT88(CONCAT44(VVar1,VVar1),CONCAT44(VVar1,VVar1));
}

Assistant:

Density(const Point3f &p, const SampledWavelengths &lambda) const {
        nanovdb::Vec3<float> pIndex =
            densityFloatGrid->worldToIndexF(nanovdb::Vec3<float>(p.x, p.y, p.z));
        using Sampler = nanovdb::SampleFromVoxels<nanovdb::FloatGrid::TreeType, 1, false>;
        Float density = Sampler(densityFloatGrid->tree())(pIndex);
        return SampledSpectrum(density);
    }